

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<std::array<solitaire::cards::Card,_52UL>_()>::Action
          (Action<std::array<solitaire::cards::Card,_52UL>_()> *this,
          ActionInterface<std::array<solitaire::cards::Card,_52UL>_()> *impl)

{
  __shared_ptr<testing::ActionInterface<std::array<solitaire::cards::Card,52ul>()>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<std::array<solitaire::cards::Card,52ul>()>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<testing::ActionInterface<std::array<solitaire::cards::Card,52ul>()>,void>
            (local_20,impl);
  std::function<std::array<solitaire::cards::Card,52ul>()>::
  function<testing::Action<std::array<solitaire::cards::Card,52ul>()>::ActionAdapter,void>
            ((function<std::array<solitaire::cards::Card,52ul>()> *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}